

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

value * __thiscall
mjs::function_object::call
          (value *__return_storage_ptr__,function_object *this,value *this_,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_function *pgVar1;
  not_callable_exception *this_00;
  gc_heap_ptr_untyped local_70;
  undefined1 local_60 [24];
  anon_union_32_5_7b1e0779_for_value_3 local_48;
  
  if ((this->call_).pos_ != 0) {
    pgVar1 = gc_heap_ptr_untracked<mjs::gc_function,_true>::dereference
                       (&this->call_,(this->super_native_object).super_object.heap_);
    (**(code **)((long)pgVar1[1] + 8))(__return_storage_ptr__,pgVar1 + 1,this_,args);
    return __return_storage_ptr__;
  }
  this_00 = (not_callable_exception *)__cxa_allocate_exception(0x10);
  gc_heap::unsafe_track<mjs::function_object>
            ((gc_heap *)local_60,(function_object *)(this->super_native_object).super_object.heap_);
  local_70.heap_ = (gc_heap *)local_60._0_8_;
  local_70.pos_ = local_60._8_4_;
  if ((gc_heap *)local_60._0_8_ == (gc_heap *)0x0) {
    local_60._16_4_ = 5;
    local_48.n_ = 0.0;
    local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_60._8_4_;
  }
  else {
    gc_heap::attach((gc_heap *)local_60._0_8_,&local_70);
    local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_70.heap_;
    local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_70.pos_;
    local_60._16_4_ = 5;
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_48.s_);
    }
  }
  not_callable_exception::not_callable_exception(this_00,(value *)(local_60 + 0x10));
  __cxa_throw(this_00,&not_callable_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value function_object::call(const value& this_, const std::vector<value>& args) const {
    if (!call_) throw not_callable_exception{value{heap().unsafe_track(*this)}};
    return call_.dereference(heap()).call(this_, args);
}